

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void pnga_zero(Integer g_a)

{
  Integer IVar1;
  Integer IVar2;
  logical lVar3;
  Integer in_RDI;
  int _i;
  int local_sync_end;
  int local_sync_begin;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  void *ptr;
  Integer num_blocks;
  Integer p_handle;
  Integer elems;
  Integer me;
  Integer type;
  Integer ndim;
  Integer *in_stack_000001d8;
  Integer *in_stack_000001e0;
  Integer in_stack_000001e8;
  Integer in_stack_000001f0;
  Integer *in_stack_000002b0;
  void *in_stack_000002b8;
  Integer *in_stack_000002c0;
  Integer *in_stack_000002c8;
  Integer in_stack_000002d0;
  int local_134;
  int iVar4;
  int iVar5;
  Integer local_128 [4];
  Integer *in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  Integer in_stack_ffffffffffffff08;
  Integer in_stack_ffffffffffffff10;
  long local_e8 [8];
  long local_a8;
  Integer *in_stack_ffffffffffffff60;
  Integer *in_stack_ffffffffffffff68;
  Integer in_stack_ffffffffffffff70;
  void *local_40;
  long local_28;
  long local_18;
  long local_10;
  
  iVar4 = _ga_sync_end;
  iVar5 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  IVar1 = pnga_get_pgroup(in_RDI);
  if (iVar5 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar5,iVar4));
  }
  IVar1 = pnga_pgroup_nodeid(IVar1);
  pnga_check_handle(_dims[2],(char *)_dims[1]);
  IVar2 = pnga_total_blocks(in_RDI);
  pnga_inquire(_dims[6],(Integer *)_dims[5],(Integer *)_dims[4],(Integer *)_dims[3]);
  if (IVar2 < 0) {
    pnga_distribution(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
    if (0 < local_e8[0]) {
      lVar3 = pnga_has_ghosts(in_RDI);
      if (lVar3 != 0) {
        pnga_zero_patch(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60);
        return;
      }
      pnga_access_ptr(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                      in_stack_000002b0);
      local_134 = 0;
      local_28 = (local_128[local_10 + -1] - local_e8[local_10 + -1]) + 1;
      for (; (long)local_134 < local_10 + -1; local_134 = local_134 + 1) {
        if ((&local_a8)[local_134] != (local_128[local_134] - local_e8[local_134]) + 1) {
          pnga_error((char *)_lo[4],_lo[3]);
        }
        local_28 = ((local_128[local_134] - local_e8[local_134]) + 1) * local_28;
      }
      memset(local_40,0,ga_types[local_18 + -1000].size * local_28);
      pnga_release_update(in_RDI,local_e8,local_128);
    }
  }
  else {
    pnga_access_block_segment_ptr
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    memset(local_40,0,ga_types[local_18 + -1000].size * local_28);
    pnga_release_update_block_segment(in_RDI,IVar1);
  }
  if (iVar4 != 0) {
    pnga_pgroup_sync(CONCAT44(iVar5,iVar4));
  }
  return;
}

Assistant:

void pnga_zero(Integer g_a)
{
  Integer ndim, type, me, elems, p_handle;
  Integer num_blocks;
  void *ptr;
  Integer _dims[MAXDIM];
  Integer _ld[MAXDIM-1];
  Integer _lo[MAXDIM];
  Integer _hi[MAXDIM];
  /*register Integer i;*/
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  p_handle = pnga_get_pgroup(g_a);

  if(local_sync_begin) pnga_pgroup_sync(p_handle);

  me = pnga_pgroup_nodeid(p_handle);

  pnga_check_handle(g_a, "ga_zero");

  num_blocks = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, _dims);
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, _lo, _hi);

    if ( _lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      if (pnga_has_ghosts(g_a)) {
        pnga_zero_patch(g_a,_lo,_hi);
        return;
      }
      pnga_access_ptr(g_a, _lo, _hi, &ptr, _ld);
      GET_ELEMS(ndim,_lo,_hi,_ld,&elems);

      /* switch (type){ */
/*         int *ia; */
/*         double *da; */
/*         float *fa; */
/*         long *la; */
/*         long long *lla; */
/*         case C_INT: */
/*         ia = (int*)ptr; */
/*         for(i=0;i<elems;i++) ia[i]  = 0; */
/*         break; */
/*         case C_DCPL: */
/*         elems *=2; */
/*         case C_DBL: */
/*         da = (double*)ptr; */
/*         for(i=0;i<elems;i++) da[i] = 0; */
/*         break; */
/*         case C_SCPL: */
/*         elems *=2; */
/*         case C_FLOAT: */
/*         fa = (float*)ptr; */
/*         for(i=0;i<elems;i++) fa[i]  = 0; */
/*         break; */
/*         case C_LONG: */
/*         la = (long*)ptr; */
/*         for(i=0;i<elems;i++) la[i]  = 0; */
/*         break; */
/*         case C_LONGLONG: */
/*         lla = (long long*)ptr; */
/*         for(i=0;i<elems;i++) lla[i]  = 0; */
/*         break; */
/*         default: pnga_error(" wrong data type ",type); */
/*       } */
      memset(ptr, 0, GAsizeofM(type)*elems);

      /* release access to the data */
      pnga_release_update(g_a, _lo, _hi);
    } 
  } else {
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
/*     switch (type){ */
/*       int *ia; */
/*       double *da; */
/*       float *fa; */
/*       long *la; */
/*       long long *lla; */
/*       case C_INT: */
/*         ia = (int*)ptr; */
/*         for(i=0;i<elems;i++) ia[i]  = 0; */
/*         break; */
/*       case C_DCPL: */
/*         elems *=2; */
/*       case C_DBL: */
/*         da = (double*)ptr; */
/*         for(i=0;i<elems;i++) da[i] = 0; */
/*         break; */
/*       case C_SCPL: */
/*         elems *=2; */
/*       case C_FLOAT: */
/*         fa = (float*)ptr; */
/*         for(i=0;i<elems;i++) fa[i]  = 0; */
/*         break; */
/*       case C_LONG: */
/*       la = (long*)ptr; */
/*       for(i=0;i<elems;i++) la[i]  = 0; */
/*       break; */
/*       case C_LONGLONG: */
/*       lla = (long long*)ptr; */
/*       for(i=0;i<elems;i++) lla[i]  = 0; */
/*       break; */
/*       default: pnga_error(" wrong data type ",type); */
/*     } */
      memset(ptr, 0, GAsizeofM(type)*elems);

    /* release access to the data */
    pnga_release_update_block_segment(g_a, me);
  }
  if(local_sync_end)pnga_pgroup_sync(p_handle);
}